

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_test.cc
# Opt level: O0

void __thiscall fizplex::NumericTest_IsInfinite_Test::TestBody(NumericTest_IsInfinite_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  bool *in_stack_fffffffffffffe88;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  string local_138;
  AssertHelper local_118;
  Message local_110;
  undefined1 local_101;
  AssertionResult local_100;
  string local_f0;
  AssertHelper local_d0;
  Message local_c8;
  undefined1 local_b9;
  AssertionResult local_b8;
  string local_a8;
  AssertHelper local_88;
  Message local_80;
  undefined1 local_71;
  AssertionResult local_70;
  string local_60;
  AssertHelper local_40;
  Message local_38 [3];
  undefined1 local_19;
  AssertionResult local_18;
  
  local_19 = is_infinite(9.583588958641e-318);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88,(type *)0x1d9941);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&local_18,(AssertionResult *)"is_infinite(inf)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/numeric_test.cc"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    testing::Message::~Message((Message *)0x1d9a22);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d9a9a);
  local_71 = is_infinite(9.58554051794207e-318);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88,(type *)0x1d9acc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_70,(AssertionResult *)"is_infinite(-inf)","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/numeric_test.cc"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message((Message *)0x1d9bbf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d9c37);
  bVar1 = is_infinite(9.58758100905939e-318);
  local_b9 = !bVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88,(type *)0x1d9c6b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)&local_b8,(AssertionResult *)"!is_infinite(31.0)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/numeric_test.cc"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    testing::Message::~Message((Message *)0x1d9d5e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d9dd6);
  bVar1 = is_infinite(9.58963138148963e-318);
  local_101 = !bVar1;
  this_00 = &local_100;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             &this_00->success_,(type *)0x1d9e00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_138,(internal *)&local_100,(AssertionResult *)"!is_infinite(-31.0)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/numeric_test.cc"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    testing::Message::~Message((Message *)0x1d9ed4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d9f40);
  return;
}

Assistant:

TEST(NumericTest, IsInfinite) {
  EXPECT_TRUE(is_infinite(inf));
  EXPECT_TRUE(is_infinite(-inf));
  EXPECT_TRUE(!is_infinite(31.0));
  EXPECT_TRUE(!is_infinite(-31.0));
}